

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

void bmcg_sat_solver_print_sop_lit(Gia_Man_t *p,int Lit)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vSupp;
  Gia_Man_t *p_00;
  int iVar3;
  int *pNodes;
  int iNode;
  
  vSupp = Vec_IntAlloc(100);
  iNode = Abc_Lit2Var(Lit);
  pNodes = &iNode;
  Gia_ManCollectCis(p,pNodes,1,vSupp);
  Vec_IntSort(vSupp,(int)pNodes);
  for (iVar3 = 0; iVar3 < vSupp->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vSupp,iVar3);
    iVar1 = Gia_ManIdToCioId(p,iVar1);
    Vec_IntWriteEntry(vSupp,iVar3,iVar1);
  }
  printf("Vector has %d entries: {");
  for (iVar3 = 0; iVar3 < vSupp->nSize; iVar3 = iVar3 + 1) {
    uVar2 = Vec_IntEntry(vSupp,iVar3);
    printf(" %d",(ulong)uVar2);
  }
  puts(" }");
  p_00 = Gia_ManDupConeSupp(p,Lit,vSupp);
  Vec_IntFree(vSupp);
  bmcg_sat_solver_print_sop(p_00);
  Gia_ManStop(p_00);
  putchar(10);
  return;
}

Assistant:

void bmcg_sat_solver_print_sop_lit( Gia_Man_t * p, int Lit )
{
    Vec_Int_t * vCisUsed = Vec_IntAlloc( 100 );
    int i, ObjId, iNode = Abc_Lit2Var( Lit );
    Gia_ManCollectCis( p, &iNode, 1, vCisUsed );
    Vec_IntSort( vCisUsed, 0 );
    Vec_IntForEachEntry( vCisUsed, ObjId, i )
        Vec_IntWriteEntry( vCisUsed, i, Gia_ManIdToCioId(p, ObjId) );
    Vec_IntPrint( vCisUsed );
    Gia_Man_t * pNew = Gia_ManDupConeSupp( p, Lit, vCisUsed );
    Vec_IntFree( vCisUsed );
    bmcg_sat_solver_print_sop( pNew );
    Gia_ManStop( pNew );
    printf( "\n" );
}